

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::pop_back(SmallVectorBase<slang::Diagnostic> *this)

{
  pointer pDVar1;
  pointer pSVar2;
  size_type sVar3;
  
  if (this->len != 0) {
    sVar3 = this->len - 1;
    this->len = sVar3;
    pDVar1 = this->data_;
    std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector
              (&pDVar1[sVar3].notes);
    pSVar2 = pDVar1[sVar3].ranges.
             super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar2 != (pointer)0x0) {
      operator_delete(pSVar2,(long)pDVar1[sVar3].ranges.
                                   super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar2
                     );
    }
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
    ::~vector(&pDVar1[sVar3].args);
    return;
  }
  assert::assertFailed
            ("len",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
             ,0x97,
             "void slang::SmallVectorBase<slang::Diagnostic>::pop_back() [T = slang::Diagnostic]");
}

Assistant:

void pop_back() {
        ASSERT(len);
        len--;
        std::destroy_at(data_ + len);
    }